

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_validateThenAnalyzeAndEvaluateSourceCodeWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t sourceCode)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  undefined1 local_60 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_b1711d3f gcFrame;
  sysbvm_tuple_t sourceCode_local;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)environment;
  memset(local_60,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_60);
  sVar2 = sysbvm_sourceCode_getLanguage(sourceCode);
  _Var1 = sysbvm_string_equalsCString(sVar2,"sysmel");
  if (_Var1) {
    gcFrame.sourceCode = sysbvm_parser_parseSourceCode(context,sourceCode);
  }
  else {
    gcFrame.sourceCode = sysbvm_parser_parseSourceCode(context,sourceCode);
  }
  sVar2 = sysbvm_interpreter_validateThenAnalyzeAndEvaluateASTWithEnvironment
                    (context,gcFrame.sourceCode,(sysbvm_tuple_t)gcFrameRecord.roots);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_60);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_validateThenAnalyzeAndEvaluateSourceCodeWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t sourceCode)
{
    struct {
        sysbvm_tuple_t environment;
        sysbvm_tuple_t sourceCode;
        sysbvm_tuple_t ast;
        sysbvm_tuple_t result;
    } gcFrame = {
        .environment = environment,
        .sourceCode = sourceCode
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    if(sysbvm_string_equalsCString(sysbvm_sourceCode_getLanguage(gcFrame.sourceCode), "sysmel"))
        gcFrame.ast = sysbvm_parser_parseSourceCode(context, gcFrame.sourceCode);
    else
        gcFrame.ast = sysbvm_parser_parseSourceCode(context, gcFrame.sourceCode);
    gcFrame.result = sysbvm_interpreter_validateThenAnalyzeAndEvaluateASTWithEnvironment(context, gcFrame.ast, gcFrame.environment);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}